

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O2

void __thiscall QFutureInterfaceBase::waitForFinished(QFutureInterfaceBase *this)

{
  uint uVar1;
  QThreadPool *pQVar2;
  QFutureInterfaceBasePrivate *this_00;
  long in_FS_OFFSET;
  undefined1 local_38 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QMutexLocker<QMutex>::QMutexLocker((QMutexLocker<QMutex> *)local_38,&this->d->m_mutex);
  uVar1 = (this->d->state).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i;
  QBasicMutex::unlock((QBasicMutex *)local_38._0_8_);
  local_38._8_8_ = local_38._8_8_ & 0xffffffffffffff00;
  this_00 = this->d;
  if ((uVar1 & 4) == 0) {
    pQVar2 = QFutureInterfaceBasePrivate::pool(this_00);
    QThreadPoolPrivate::stealAndRunRunnable
              ((QThreadPoolPrivate *)(pQVar2->super_QObject).d_ptr.d,this->d->runnable);
    QBasicMutex::lock((QBasicMutex *)local_38._0_8_);
    local_38[8] = 1;
    while (this_00 = this->d,
          ((this_00->state).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i & 4U) == 0) {
      QWaitCondition::wait(&this_00->waitCondition,this_00);
    }
  }
  if (this_00->hasException == true) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      QtPrivate::ExceptionStore::rethrowException(&(this_00->data).m_exceptionStore);
    }
  }
  else {
    QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_38);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QFutureInterfaceBase::waitForFinished()
{
    QMutexLocker lock(&d->m_mutex);
    const bool alreadyFinished = isFinished();
    lock.unlock();

    if (!alreadyFinished) {
        d->pool()->d_func()->stealAndRunRunnable(d->runnable);

        lock.relock();

        while (!isFinished())
            d->waitCondition.wait(&d->m_mutex);
    }

    if (d->hasException)
        d->data.m_exceptionStore.rethrowException();
}